

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_decimal<unsigned_long_long>
          (arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          unsigned_long_long value)

{
  checked_ptr<typename_buffer<char>::value_type> pcVar1;
  char *pcVar2;
  char *local_38;
  char **local_30;
  checked_ptr<typename_buffer<char>::value_type> *it;
  int num_digits;
  bool negative;
  uint32_or_64_or_128_t<unsigned_long_long> abs_value;
  unsigned_long_long value_local;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this_local;
  
  _num_digits = value;
  abs_value = value;
  value_local = (unsigned_long_long)this;
  it._7_1_ = is_negative<unsigned_long_long,_0>(value);
  if ((bool)it._7_1_) {
    _num_digits = (_num_digits ^ 0xffffffffffffffff) + 1;
  }
  it._0_4_ = count_digits(_num_digits);
  pcVar1 = reserve(this,(long)(int)(uint)((it._7_1_ & 1) != 0) + (long)(int)it);
  local_30 = &local_38;
  local_38 = pcVar1;
  if ((it._7_1_ & 1) != 0) {
    local_38 = pcVar1 + 1;
    *pcVar1 = '-';
  }
  pcVar2 = format_decimal<char,char*,unsigned_long>(local_38,_num_digits,(int)it);
  *local_30 = pcVar2;
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }